

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseMember(Parser *this,SyntaxKind parentKind,bool *anyLocalModules)

{
  Token colon;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> elements_00;
  Token keyword_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_01;
  Token semi;
  Token name_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_02;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_03;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_04;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_05;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_06;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_07;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_08;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_09;
  Token semi_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_10;
  Token rand_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_11;
  Token semi_01;
  Token keyword_01;
  Token keyword_02;
  Token endgenerate_00;
  SourceRange range;
  AttrList attributes_00;
  AttrList attributes_01;
  AttrList attributes_02;
  AttrList attributes_03;
  AttrList attributes_04;
  AttrList attributes_05;
  AttrList attributes_06;
  AttrList attributes_07;
  AttrList attributes_08;
  AttrList attr;
  AttrList attributes_09;
  AttrList attributes_10;
  AttrList attributes_11;
  AttrList attributes_12;
  AttrList attributes_13;
  AttrList attributes_14;
  AttrList attributes_15;
  AttrList attributes_16;
  AttrList attributes_17;
  AttrList attributes_18;
  AttrList attributes_19;
  AttrList attributes_20;
  AttrList attributes_21;
  AttrList attributes_22;
  AttrList attributes_23;
  AttrList attributes_24;
  AttrList attributes_25;
  AttrList attributes_26;
  AttrList attr_00;
  AttrList attributes_27;
  SourceLocation location;
  SourceLocation location_00;
  AttrList attributes_28;
  AttrList attr_01;
  AttrList attributes_29;
  Token virtualOrInterface;
  Token virtualOrInterface_00;
  AttrList attributes_30;
  AttrList attributes_31;
  AttrList attributes_32;
  AttrList attributes_33;
  AttrList attributes_34;
  AttrList attributes_35;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers;
  span<slang::parsing::Token,_18446744073709551615UL> qualifiers_00;
  AttrList attributes_36;
  AttrList attributes_37;
  AttrList attributes_38;
  AttrList attributes_39;
  AttrList attributes_40;
  AttrList attributes_41;
  AttrList attributes_42;
  AttrList attributes_43;
  AttrList attributes_44;
  AttrList attributes_45;
  AttrList attributes_46;
  bool bVar1;
  HierarchyInstantiationSyntax *pHVar2;
  PortDeclarationSyntax *pPVar3;
  MemberSyntax *pMVar4;
  StatementSyntax *this_00;
  ImmediateAssertionMemberSyntax *pIVar5;
  ConcurrentAssertionMemberSyntax *pCVar6;
  ClassDeclarationSyntax *pCVar7;
  ElabSystemTaskSyntax *pEVar8;
  FunctionDeclarationSyntax *pFVar9;
  Diagnostic *this_01;
  pointer ppAVar10;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> in_RDI;
  Token TVar11;
  SourceRange SVar12;
  string_view sVar13;
  Token qual;
  uint32_t i_1;
  SmallVector<slang::parsing::Token,_4UL> quals;
  SyntaxKind kind;
  uint32_t i;
  uint32_t index;
  Token t;
  MemberSyntax *member;
  Token rand;
  ElabSystemTaskSyntax *result;
  Token keyword_2;
  Token keyword_1;
  ConcurrentAssertionStatementSyntax *statement_2;
  StatementSyntax *statement_1;
  StatementSyntax *statement;
  NamedLabelSyntax *label;
  Token name;
  TokenKind next;
  span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> members;
  Token endgenerate;
  Token keyword;
  Token token;
  AttrList attributes;
  undefined4 in_stack_fffffffffffff2c8;
  undefined4 in_stack_fffffffffffff2cc;
  undefined4 in_stack_fffffffffffff2d0;
  uint32_t in_stack_fffffffffffff2d4;
  undefined4 in_stack_fffffffffffff2d8;
  undefined4 uVar14;
  SyntaxKind in_stack_fffffffffffff2dc;
  undefined4 uVar15;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff2e0;
  __extent_storage<18446744073709551615UL> this_02;
  ParserBase *in_stack_fffffffffffff2e8;
  SourceLocation in_stack_fffffffffffff2f0;
  SourceLocation in_stack_fffffffffffff2f8;
  char *in_stack_fffffffffffff300;
  DiagCode DVar16;
  ParserBase *in_stack_fffffffffffff330;
  SourceLocation in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff340;
  DiagCode in_stack_fffffffffffff344;
  undefined2 in_stack_fffffffffffff348;
  undefined2 in_stack_fffffffffffff34a;
  undefined4 in_stack_fffffffffffff34c;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff350;
  TokenKind in_stack_fffffffffffff35e;
  ParserBase *in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff378;
  undefined4 in_stack_fffffffffffff37c;
  Parser *in_stack_fffffffffffff398;
  undefined8 in_stack_fffffffffffff3a0;
  undefined4 in_stack_fffffffffffff3d0;
  undefined4 in_stack_fffffffffffff3d4;
  Parser *in_stack_fffffffffffff3d8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff3e0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff3e8;
  Parser *in_stack_fffffffffffff400;
  AttrList in_stack_fffffffffffff408;
  Parser *in_stack_fffffffffffff428;
  AttrList in_stack_fffffffffffff430;
  SyntaxKind in_stack_fffffffffffff44c;
  undefined8 in_stack_fffffffffffff450;
  Parser *in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff460;
  bitmask<slang::parsing::detail::FunctionOptions> in_stack_fffffffffffff464;
  Parser *in_stack_fffffffffffff468;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff470;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff478;
  Parser *in_stack_fffffffffffff488;
  pointer in_stack_fffffffffffff490;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff498;
  Parser *in_stack_fffffffffffff4a0;
  undefined4 in_stack_fffffffffffff4a8;
  SyntaxKind in_stack_fffffffffffff4ac;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff4b0;
  undefined4 in_stack_fffffffffffff4b8;
  SyntaxKind in_stack_fffffffffffff4bc;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff4c0;
  undefined8 in_stack_fffffffffffff4c8;
  Parser *in_stack_fffffffffffff4d0;
  Parser *in_stack_fffffffffffff4e0;
  undefined2 in_stack_fffffffffffff4e8;
  TokenKind TVar17;
  undefined6 in_stack_fffffffffffff4ea;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff4f0;
  undefined4 in_stack_fffffffffffff4f8;
  undefined4 in_stack_fffffffffffff4fc;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff500;
  pointer in_stack_fffffffffffff508;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff510;
  Parser *in_stack_fffffffffffff518;
  AttrList in_stack_fffffffffffff520;
  Parser *in_stack_fffffffffffff540;
  AttrList in_stack_fffffffffffff548;
  bitmask<slang::parsing::detail::FunctionOptions> local_aa4;
  pointer local_aa0;
  size_t local_a98;
  undefined4 local_a8c;
  SyntaxKind in_stack_fffffffffffff57c;
  undefined6 in_stack_fffffffffffff580;
  undefined2 in_stack_fffffffffffff586;
  undefined2 in_stack_fffffffffffff588;
  undefined2 in_stack_fffffffffffff58a;
  undefined4 in_stack_fffffffffffff58c;
  uint uVar18;
  undefined6 in_stack_fffffffffffff590;
  TokenKind in_stack_fffffffffffff596;
  BumpAllocator *in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a4;
  Parser *in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  uint uVar19;
  TokenKind local_a40;
  undefined8 in_stack_fffffffffffff5e0;
  SyntaxKind SVar20;
  Parser *in_stack_fffffffffffff5e8;
  pointer in_stack_fffffffffffff5f0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5f8;
  Parser *in_stack_fffffffffffff600;
  undefined8 in_stack_fffffffffffff608;
  Parser *in_stack_fffffffffffff610;
  pointer in_stack_fffffffffffff618;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff620;
  Parser *in_stack_fffffffffffff648;
  pointer in_stack_fffffffffffff650;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff658;
  undefined1 in_stack_fffffffffffff667;
  Parser *in_stack_fffffffffffff668;
  Parser *in_stack_fffffffffffff670;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff678;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff680;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff688;
  undefined8 in_stack_fffffffffffff6d0;
  undefined2 uVar21;
  Parser *in_stack_fffffffffffff6d8;
  pointer in_stack_fffffffffffff6e0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff6e8;
  TokenKind local_8f8;
  TokenKind local_8d8;
  Parser *in_stack_fffffffffffff7a0;
  pointer in_stack_fffffffffffff7a8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff7b0;
  TokenKind local_7e8;
  TokenKind local_7b8;
  Parser *in_stack_fffffffffffff868;
  pointer in_stack_fffffffffffff870;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff878;
  TokenKind local_778;
  bitmask<slang::parsing::detail::FunctionOptions> local_734;
  pointer local_730;
  size_t local_728;
  bitmask<slang::parsing::detail::FunctionOptions> local_71c;
  pointer local_718;
  size_t local_710;
  pointer local_708;
  size_t local_700;
  pointer local_6f8;
  size_t local_6f0;
  pointer local_6e8;
  size_t local_6e0;
  pointer local_6d8;
  size_t local_6d0;
  undefined8 local_6c8;
  Info *local_6c0;
  pointer local_6b8;
  size_t local_6b0;
  Token local_670;
  undefined8 local_660;
  Info *local_658;
  pointer local_650;
  size_t local_648;
  Token local_608;
  pointer local_5f8;
  size_t local_5f0;
  pointer local_5e8;
  size_t local_5e0;
  ConcurrentAssertionStatementSyntax *local_590;
  pointer local_588;
  size_t local_580;
  pointer local_540;
  size_t local_538;
  StatementSyntax *local_4e8;
  pointer local_4e0;
  size_t local_4d8;
  pointer local_4d0;
  size_t local_4c8;
  Token local_4c0;
  Token local_4b0;
  Token local_4a0;
  pointer local_490;
  size_t local_488;
  pointer local_480;
  size_t local_478;
  Token local_470;
  Token local_460;
  Token local_450;
  pointer local_440;
  size_t local_438;
  Token local_430;
  Token local_420;
  pointer local_410;
  size_t local_408;
  pointer local_3c8;
  size_t local_3c0;
  Parser *in_stack_fffffffffffffc80;
  pointer in_stack_fffffffffffffc88;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc90;
  TokenKind local_328;
  TokenKind local_310;
  TokenKind local_270;
  undefined1 in_stack_fffffffffffffe06;
  undefined1 in_stack_fffffffffffffe07;
  Parser *in_stack_fffffffffffffe08;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_b0;
  SyntaxFactory *local_a8;
  Token local_80;
  pointer local_70;
  size_t local_68;
  pointer local_60;
  size_t local_58;
  pointer local_50;
  size_t local_48;
  pointer local_40;
  size_t local_38;
  AttrList local_30;
  ConfigDeclarationSyntax *local_8;
  
  TVar17 = (TokenKind)((ulong)in_stack_fffffffffffff4c8 >> 0x30);
  uVar21 = (undefined2)((ulong)in_stack_fffffffffffff6d0 >> 0x30);
  SVar20 = (SyntaxKind)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  local_30 = parseAttributes((Parser *)in_stack_fffffffffffff500._M_extent_value);
  bVar1 = isHierarchyInstantiation
                    ((Parser *)in_stack_fffffffffffff338,
                     SUB81((ulong)in_stack_fffffffffffff330 >> 0x38,0));
  if (bVar1) {
    local_40 = local_30._M_ptr;
    local_38 = local_30._M_extent._M_extent_value;
    attributes_28._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffff5b8;
    attributes_28._M_ptr = (pointer)in_stack_fffffffffffff5b0;
    attributes_28._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffff5bc;
    pHVar2 = parseHierarchyInstantiation(in_stack_fffffffffffff5a8,attributes_28);
    return &pHVar2->super_MemberSyntax;
  }
  bVar1 = isPortDeclaration((Parser *)in_stack_fffffffffffff338,
                            SUB81((ulong)in_stack_fffffffffffff330 >> 0x38,0));
  if (bVar1) {
    local_50 = local_30._M_ptr;
    local_48 = local_30._M_extent._M_extent_value;
    pPVar3 = parsePortDeclaration(in_stack_fffffffffffff400,in_stack_fffffffffffff408);
    return &pPVar3->super_MemberSyntax;
  }
  bVar1 = isNetDeclaration((Parser *)CONCAT44(in_stack_fffffffffffff37c,in_stack_fffffffffffff378));
  if (bVar1) {
    local_60 = local_30._M_ptr;
    local_58 = local_30._M_extent._M_extent_value;
    attributes_35._M_extent._M_extent_value = in_stack_fffffffffffff658._M_extent_value;
    attributes_35._M_ptr = in_stack_fffffffffffff650;
    pMVar4 = parseNetDeclaration(in_stack_fffffffffffff648,attributes_35);
    return pMVar4;
  }
  bVar1 = isVariableDeclaration(in_stack_fffffffffffff398);
  if (bVar1) {
    local_70 = local_30._M_ptr;
    local_68 = local_30._M_extent._M_extent_value;
    attributes_36._M_extent._M_extent_value = in_stack_fffffffffffff680._M_extent_value;
    attributes_36._M_ptr = (pointer)in_stack_fffffffffffff678._M_extent_value;
    pMVar4 = parseVariableDeclaration(in_stack_fffffffffffff670,attributes_36);
    return pMVar4;
  }
  local_80 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
  ppAVar10 = (pointer)(ulong)(local_80._0_4_ - 2 & 0xffff);
  switch(ppAVar10) {
  case (pointer)0x0:
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_310 = TVar11.kind;
    if (local_310 == Colon) {
      TVar11 = ParserBase::peek((ParserBase *)
                                CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                in_stack_fffffffffffff2d4);
      local_328 = TVar11.kind;
      if (((local_328 == AssertKeyword) || (local_328 == AssumeKeyword)) ||
         (local_328 == CoverKeyword)) {
        ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
        ParserBase::expect(in_stack_fffffffffffff360,in_stack_fffffffffffff35e);
        name_00.rawLen = in_stack_fffffffffffff2dc;
        name_00.kind = (short)in_stack_fffffffffffff2d8;
        name_00._2_1_ = (char)((uint)in_stack_fffffffffffff2d8 >> 0x10);
        name_00.numFlags.raw = (char)((uint)in_stack_fffffffffffff2d8 >> 0x18);
        name_00.info = (Info *)in_stack_fffffffffffff2e0._M_extent_value;
        colon.rawLen = in_stack_fffffffffffff2cc;
        colon.kind = (short)in_stack_fffffffffffff2c8;
        colon._2_1_ = (char)((uint)in_stack_fffffffffffff2c8 >> 0x10);
        colon.numFlags.raw = (char)((uint)in_stack_fffffffffffff2c8 >> 0x18);
        colon.info._0_4_ = in_stack_fffffffffffff2d0;
        colon.info._4_4_ = in_stack_fffffffffffff2d4;
        slang::syntax::SyntaxFactory::namedLabel((SyntaxFactory *)0x8a2d20,name_00,colon);
        std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
                  ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                   0x8a2d45);
        this_00 = parseAssertionStatement
                            (in_stack_fffffffffffff518,
                             (NamedLabelSyntax *)in_stack_fffffffffffff510._M_extent_value,
                             in_stack_fffffffffffff520);
        SVar20 = (this_00->super_SyntaxNode).kind;
        if ((SVar20 != ImmediateAssertStatement) &&
           (SVar20 != ImmediateAssumeStatement && SVar20 != ImmediateCoverStatement)) {
          local_410 = local_30._M_ptr;
          local_408 = local_30._M_extent._M_extent_value;
          elements_03._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
          elements_03._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
          elements_03._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
          slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                    ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                     CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_03);
          slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                    (&this_00->super_SyntaxNode);
          pCVar6 = slang::syntax::SyntaxFactory::concurrentAssertionMember
                             ((SyntaxFactory *)
                              CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                              (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                              (ConcurrentAssertionStatementSyntax *)0x8a2ea0);
          return &pCVar6->super_MemberSyntax;
        }
        local_3c8 = local_30._M_ptr;
        local_3c0 = local_30._M_extent._M_extent_value;
        elements_02._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
        elements_02._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
        elements_02._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                   CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_02);
        slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                  (&this_00->super_SyntaxNode);
        pIVar5 = slang::syntax::SyntaxFactory::immediateAssertionMember
                           ((SyntaxFactory *)
                            CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                            (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                            CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                            (ImmediateAssertionStatementSyntax *)0x8a2e1b);
        return &pIVar5->super_MemberSyntax;
      }
    }
    local_420 = ParserBase::peek((ParserBase *)
                                 CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                 in_stack_fffffffffffff2d4);
    bVar1 = true;
    if (local_420.kind != Hash) {
      local_430 = ParserBase::peek((ParserBase *)
                                   CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                   in_stack_fffffffffffff2d4);
      bVar1 = local_430.kind == OpenParenthesis;
    }
    if (bVar1) {
      local_440 = local_30._M_ptr;
      local_438 = local_30._M_extent._M_extent_value;
      attributes_37._M_extent._M_extent_value = in_stack_fffffffffffff680._M_extent_value;
      attributes_37._M_ptr = (pointer)in_stack_fffffffffffff678._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                parsePrimitiveInstantiation(in_stack_fffffffffffff670,attributes_37);
    }
    else {
      local_450 = ParserBase::peek((ParserBase *)
                                   CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                   in_stack_fffffffffffff2d4);
      bVar1 = false;
      if (local_450.kind == DoubleColon) {
        local_460 = ParserBase::peek((ParserBase *)
                                     CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                     in_stack_fffffffffffff2d4);
        bVar1 = false;
        if (local_460.kind == Identifier) {
          local_470 = ParserBase::peek((ParserBase *)
                                       CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8)
                                       ,in_stack_fffffffffffff2d4);
          bVar1 = local_470.kind == Identifier;
        }
      }
      if (bVar1) {
        local_480 = local_30._M_ptr;
        local_478 = local_30._M_extent._M_extent_value;
        attributes_24._M_ptr._4_4_ = in_stack_fffffffffffff4fc;
        attributes_24._M_ptr._0_4_ = in_stack_fffffffffffff4f8;
        attributes_24._M_extent._M_extent_value = in_stack_fffffffffffff500._M_extent_value;
        local_8 = (ConfigDeclarationSyntax *)
                  parseCheckerInstantiation
                            ((Parser *)in_stack_fffffffffffff4f0._M_extent_value,attributes_24);
      }
      else {
        local_490 = local_30._M_ptr;
        local_488 = local_30._M_extent._M_extent_value;
        attributes_38._M_extent._M_extent_value = in_stack_fffffffffffff680._M_extent_value;
        attributes_38._M_ptr = (pointer)in_stack_fffffffffffff678._M_extent_value;
        local_8 = (ConfigDeclarationSyntax *)
                  parseVariableDeclaration(in_stack_fffffffffffff670,attributes_38);
      }
    }
    break;
  case (pointer)0x1:
    pEVar8 = parseElabSystemTask(in_stack_fffffffffffff428,in_stack_fffffffffffff430);
    goto joined_r0x008a4181;
  default:
    goto LAB_008a4226;
  case (pointer)0x11:
    elements_09._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements_09._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements_09._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_09);
    slang::syntax::TokenList::TokenList
              ((TokenList *)in_stack_fffffffffffff2e0._M_extent_value,
               (nullptr_t)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8));
    ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
    semi_00.rawLen = in_stack_fffffffffffff2dc;
    semi_00.kind = (short)in_stack_fffffffffffff2d8;
    semi_00._2_1_ = (char)((uint)in_stack_fffffffffffff2d8 >> 0x10);
    semi_00.numFlags.raw = (char)((uint)in_stack_fffffffffffff2d8 >> 0x18);
    semi_00.info = (Info *)in_stack_fffffffffffff2e0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::emptyMember
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                         (TokenList *)0x8a3c87,semi_00);
    break;
  case (pointer)0x5c:
    attributes_22._M_ptr._2_6_ = in_stack_fffffffffffff4ea;
    attributes_22._M_ptr._0_2_ = in_stack_fffffffffffff4e8;
    attributes_22._M_extent._M_extent_value = in_stack_fffffffffffff4f0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)parseNetAlias(in_stack_fffffffffffff4e0,attributes_22);
    break;
  case (pointer)0x5d:
  case (pointer)0x5e:
  case (pointer)0x5f:
  case (pointer)0x60:
  case (pointer)0xa6:
    local_670 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
    slang::syntax::SyntaxFacts::getProceduralBlockKind(local_670.kind);
    local_6b8 = local_30._M_ptr;
    local_6b0 = local_30._M_extent._M_extent_value;
    elements_08._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements_08._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements_08._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_08);
    TVar11 = local_670;
    local_6c8._0_2_ = local_670.kind;
    local_6c8._2_1_ = local_670._2_1_;
    local_6c8._3_1_ = local_670.numFlags.raw;
    local_6c8._4_4_ = local_670.rawLen;
    local_670.info = TVar11.info;
    local_6c0 = local_670.info;
    local_670 = TVar11;
    parseStatement(in_stack_fffffffffffffe08,(bool)in_stack_fffffffffffffe07,
                   (bool)in_stack_fffffffffffffe06);
    keyword_02.info = (Info *)in_stack_fffffffffffff2f0;
    keyword_02._0_8_ = in_stack_fffffffffffff2e8;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::proceduralBlock
                        ((SyntaxFactory *)in_stack_fffffffffffff2e0._M_extent_value,
                         in_stack_fffffffffffff2dc,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),keyword_02,
                         (StatementSyntax *)
                         CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
    break;
  case (pointer)0x62:
  case (pointer)0x64:
  case (pointer)0x7f:
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x8a3202);
    local_4e8 = parseAssertionStatement
                          (in_stack_fffffffffffff518,
                           (NamedLabelSyntax *)in_stack_fffffffffffff510._M_extent_value,
                           in_stack_fffffffffffff520);
    SVar20 = (local_4e8->super_SyntaxNode).kind;
    if ((SVar20 == ImmediateAssertStatement) ||
       (SVar20 == ImmediateAssumeStatement || SVar20 == ImmediateCoverStatement)) {
      local_540 = local_30._M_ptr;
      local_538 = local_30._M_extent._M_extent_value;
      elements_04._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
      elements_04._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
      elements_04._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_04);
      slang::syntax::SyntaxNode::as<slang::syntax::ImmediateAssertionStatementSyntax>
                (&local_4e8->super_SyntaxNode);
      local_8 = (ConfigDeclarationSyntax *)
                slang::syntax::SyntaxFactory::immediateAssertionMember
                          ((SyntaxFactory *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                           (ImmediateAssertionStatementSyntax *)0x8a32d4);
    }
    else {
      local_588 = local_30._M_ptr;
      local_580 = local_30._M_extent._M_extent_value;
      elements_05._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
      elements_05._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
      elements_05._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_05);
      slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
                (&local_4e8->super_SyntaxNode);
      local_8 = (ConfigDeclarationSyntax *)
                slang::syntax::SyntaxFactory::concurrentAssertionMember
                          ((SyntaxFactory *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                           (ConcurrentAssertionStatementSyntax *)0x8a3359);
    }
    break;
  case (pointer)0x63:
    local_5f8 = local_30._M_ptr;
    local_5f0 = local_30._M_extent._M_extent_value;
    attributes_26._M_extent._M_extent_value = in_stack_fffffffffffff510._M_extent_value;
    attributes_26._M_ptr = in_stack_fffffffffffff508;
    local_8 = (ConfigDeclarationSyntax *)
              parseContinuousAssign
                        ((Parser *)in_stack_fffffffffffff500._M_extent_value,attributes_26);
    break;
  case (pointer)0x67:
    attributes_01._M_ptr._2_2_ = in_stack_fffffffffffff34a;
    attributes_01._M_ptr._0_2_ = in_stack_fffffffffffff348;
    attributes_01._M_ptr._4_4_ = in_stack_fffffffffffff34c;
    attributes_01._M_extent._M_extent_value = in_stack_fffffffffffff350._M_extent_value;
    errorIfAttributes((Parser *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                      attributes_01);
    bVar1 = std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                      ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                       0x8a2727);
    if (bVar1) {
      Token::location(&local_80);
      ParserBase::addDiag(in_stack_fffffffffffff330,in_stack_fffffffffffff344,
                          in_stack_fffffffffffff338);
      local_8 = (ConfigDeclarationSyntax *)parseGenerateBlock(in_stack_fffffffffffff518);
    }
    else {
      elements_01._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
      elements_01._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
      elements_01._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
      slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_01);
      slang::syntax::TokenList::TokenList
                ((TokenList *)in_stack_fffffffffffff2e0._M_extent_value,
                 (nullptr_t)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8));
      Token::location(&local_80);
      location._4_4_ = in_stack_fffffffffffff5a4;
      location._0_4_ = in_stack_fffffffffffff5a0;
      Token::createMissing(in_stack_fffffffffffff598,in_stack_fffffffffffff596,location);
      semi.rawLen = in_stack_fffffffffffff2dc;
      semi.kind = (short)in_stack_fffffffffffff2d8;
      semi._2_1_ = (char)((uint)in_stack_fffffffffffff2d8 >> 0x10);
      semi.numFlags.raw = (char)((uint)in_stack_fffffffffffff2d8 >> 0x18);
      semi.info = (Info *)in_stack_fffffffffffff2e0._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                slang::syntax::SyntaxFactory::emptyMember
                          ((SyntaxFactory *)
                           CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                           (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                           CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                           (TokenList *)0x8a2812,semi);
    }
    break;
  case (pointer)0x68:
    attr_01._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffff5b8;
    attr_01._M_ptr = (pointer)in_stack_fffffffffffff5b0;
    attr_01._M_extent._M_extent_value._4_4_ = in_stack_fffffffffffff5bc;
    local_8 = (ConfigDeclarationSyntax *)parseBindDirective(in_stack_fffffffffffff5a8,attr_01);
    break;
  case (pointer)0x71:
    local_6f8 = local_30._M_ptr;
    local_6f0 = local_30._M_extent._M_extent_value;
    attributes_44._M_extent._M_extent_value = in_stack_fffffffffffff7b0._M_extent_value;
    attributes_44._M_ptr = in_stack_fffffffffffff7a8;
    local_8 = (ConfigDeclarationSyntax *)
              parseCaseGenerateConstruct(in_stack_fffffffffffff7a0,attributes_44);
    break;
  case (pointer)0x76:
    attributes_13._M_extent._M_extent_value = in_stack_fffffffffffff470._M_extent_value;
    attributes_13._M_ptr = (pointer)in_stack_fffffffffffff468;
    local_8 = (ConfigDeclarationSyntax *)
              parseCheckerDeclaration
                        ((Parser *)
                         CONCAT44(in_stack_fffffffffffff464.m_bits,in_stack_fffffffffffff460),
                         attributes_13);
    break;
  case (pointer)0x77:
    Token::Token((Token *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
    attributes_31._M_extent._M_extent_value = in_stack_fffffffffffff620._M_extent_value;
    attributes_31._M_ptr = in_stack_fffffffffffff618;
    virtualOrInterface_00.info = (Info *)in_stack_fffffffffffff610;
    virtualOrInterface_00.kind = (short)in_stack_fffffffffffff608;
    virtualOrInterface_00._2_1_ = (char)((ulong)in_stack_fffffffffffff608 >> 0x10);
    virtualOrInterface_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffff608 >> 0x18);
    virtualOrInterface_00.rawLen = (int)((ulong)in_stack_fffffffffffff608 >> 0x20);
    local_8 = (ConfigDeclarationSyntax *)
              parseClassDeclaration(in_stack_fffffffffffff600,attributes_31,virtualOrInterface_00);
    break;
  case (pointer)0x78:
    attributes_34._M_extent._M_extent_value = in_stack_fffffffffffff620._M_extent_value;
    attributes_34._M_ptr = in_stack_fffffffffffff618;
    local_8 = (ConfigDeclarationSyntax *)
              parseClockingDeclaration(in_stack_fffffffffffff610,attributes_34);
    break;
  case (pointer)0x7a:
    attributes_05._M_ptr._2_2_ = in_stack_fffffffffffff34a;
    attributes_05._M_ptr._0_2_ = in_stack_fffffffffffff348;
    attributes_05._M_ptr._4_4_ = in_stack_fffffffffffff34c;
    attributes_05._M_extent._M_extent_value = in_stack_fffffffffffff350._M_extent_value;
    errorIfAttributes((Parser *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                      attributes_05);
    attributes_46._M_extent._M_extent_value = in_stack_fffffffffffffc90._M_extent_value;
    attributes_46._M_ptr = in_stack_fffffffffffffc88;
    local_8 = parseConfigDeclaration(in_stack_fffffffffffffc80,attributes_46);
    break;
  case (pointer)0x7c:
    std::span<slang::parsing::Token,_18446744073709551615UL>::span
              ((span<slang::parsing::Token,_18446744073709551615UL> *)0x8a3f73);
    attributes_41._M_extent._M_extent_value = in_stack_fffffffffffff688._M_extent_value;
    attributes_41._M_ptr = (pointer)in_stack_fffffffffffff680._M_extent_value;
    qualifiers._M_extent._M_extent_value = in_stack_fffffffffffff678._M_extent_value;
    qualifiers._M_ptr = (pointer)in_stack_fffffffffffff670;
    local_8 = (ConfigDeclarationSyntax *)
              parseConstraint(in_stack_fffffffffffff668,attributes_41,qualifiers,
                              (bool)in_stack_fffffffffffff667);
    break;
  case (pointer)0x80:
    attributes_43._M_extent._M_extent_value = in_stack_fffffffffffff6e8._M_extent_value;
    attributes_43._M_ptr = in_stack_fffffffffffff6e0;
    local_8 = (ConfigDeclarationSyntax *)
              parseCovergroupDeclaration
                        (in_stack_fffffffffffff6d8,attributes_43,SUB21((ushort)uVar21 >> 8,0),
                         SUB21(uVar21,0));
    break;
  case (pointer)0x84:
  case (pointer)0xb1:
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_8d8 = TVar11.kind;
    if (local_8d8 == ClockingKeyword) {
      attributes_33._M_extent._M_extent_value = in_stack_fffffffffffff620._M_extent_value;
      attributes_33._M_ptr = in_stack_fffffffffffff618;
      pMVar4 = parseClockingDeclaration(in_stack_fffffffffffff610,attributes_33);
      return pMVar4;
    }
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_8f8 = TVar11.kind;
    bVar1 = false;
    if (local_8f8 == DisableKeyword) {
      bVar1 = local_80.kind == DefaultKeyword;
    }
    if (bVar1) {
      attributes_08._M_extent._M_extent_value = in_stack_fffffffffffff3e8._M_extent_value;
      attributes_08._M_ptr = (pointer)in_stack_fffffffffffff3e0._M_extent_value;
      pMVar4 = parseDefaultDisable(in_stack_fffffffffffff3d8,attributes_08);
      return pMVar4;
    }
    goto LAB_008a4226;
  case (pointer)0x85:
    attributes_23._M_ptr._2_6_ = in_stack_fffffffffffff4ea;
    attributes_23._M_ptr._0_2_ = in_stack_fffffffffffff4e8;
    attributes_23._M_extent._M_extent_value = in_stack_fffffffffffff4f0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)parseDefParam(in_stack_fffffffffffff4e0,attributes_23);
    break;
  case (pointer)0xa3:
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_7e8 = TVar11.kind;
    if (local_7e8 == StringLiteral) {
      attributes_17._M_extent._M_extent_value = in_stack_fffffffffffff498._M_extent_value;
      attributes_17._M_ptr = in_stack_fffffffffffff490;
      local_8 = (ConfigDeclarationSyntax *)parseDPIExport(in_stack_fffffffffffff488,attributes_17);
    }
    else {
      attributes_27._M_ptr._2_1_ = SUB21(in_stack_fffffffffffff58a,0);
      attributes_27._M_ptr._3_1_ = SUB21(in_stack_fffffffffffff58a,1);
      attributes_27._M_ptr._0_2_ = in_stack_fffffffffffff588;
      attributes_27._M_ptr._4_4_ = in_stack_fffffffffffff58c;
      attributes_27._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffff590;
      attributes_27._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffff596;
      local_8 = (ConfigDeclarationSyntax *)
                parseExportDeclaration
                          ((Parser *)CONCAT26(in_stack_fffffffffffff586,in_stack_fffffffffffff580),
                           attributes_27);
    }
    break;
  case (pointer)0xa5:
    attributes_04._M_ptr._2_2_ = in_stack_fffffffffffff34a;
    attributes_04._M_ptr._0_2_ = in_stack_fffffffffffff348;
    attributes_04._M_ptr._4_4_ = in_stack_fffffffffffff34c;
    attributes_04._M_extent._M_extent_value = in_stack_fffffffffffff350._M_extent_value;
    errorIfAttributes((Parser *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                      attributes_04);
    attributes_29._M_extent._M_extent_value = in_stack_fffffffffffff5f8._M_extent_value;
    attributes_29._M_ptr = in_stack_fffffffffffff5f0;
    pEVar8 = (ElabSystemTaskSyntax *)
             parseExternMember(in_stack_fffffffffffff5e8,SVar20,attributes_29);
joined_r0x008a4181:
    if (pEVar8 != (ElabSystemTaskSyntax *)0x0) {
      return &pEVar8->super_MemberSyntax;
    }
    goto LAB_008a4226;
  case (pointer)0xa8:
    local_6d8 = local_30._M_ptr;
    local_6d0 = local_30._M_extent._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)
              parseLoopGenerateConstruct(in_stack_fffffffffffff540,in_stack_fffffffffffff548);
    break;
  case (pointer)0xae:
    local_730 = local_30._M_ptr;
    local_728 = local_30._M_extent._M_extent_value;
    memset(&local_734,0,4);
    bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_734);
    attributes_12._M_extent._M_extent_value = in_stack_fffffffffffff470._M_extent_value;
    attributes_12._M_ptr = (pointer)in_stack_fffffffffffff468;
    local_8 = (ConfigDeclarationSyntax *)
              parseFunctionDeclaration
                        (in_stack_fffffffffffff458,attributes_12,
                         (SyntaxKind)((ulong)in_stack_fffffffffffff450 >> 0x20),
                         (TokenKind)((ulong)in_stack_fffffffffffff450 >> 0x10),
                         in_stack_fffffffffffff44c,in_stack_fffffffffffff464);
    break;
  case (pointer)0xaf:
    attributes_00._M_ptr._2_2_ = in_stack_fffffffffffff34a;
    attributes_00._M_ptr._0_2_ = in_stack_fffffffffffff348;
    attributes_00._M_ptr._4_4_ = in_stack_fffffffffffff34c;
    attributes_00._M_extent._M_extent_value = in_stack_fffffffffffff350._M_extent_value;
    errorIfAttributes((Parser *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                      attributes_00);
    ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
    Token::Token((Token *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
    parseMemberList<slang::syntax::MemberSyntax,slang::parsing::Parser::parseMember(slang::syntax::SyntaxKind,bool&)::__0>
              (in_stack_fffffffffffff4d0,TVar17,(Token *)in_stack_fffffffffffff4c0._M_extent_value,
               in_stack_fffffffffffff4bc,
               (anon_class_8_1_8991fb9c *)in_stack_fffffffffffff4b0._M_extent_value);
    elements._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements);
    elements_00._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements_00._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements_00._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::MemberSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::MemberSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_00);
    keyword_00.rawLen = in_stack_fffffffffffff2dc;
    keyword_00.kind = (short)in_stack_fffffffffffff2d8;
    keyword_00._2_1_ = (char)((uint)in_stack_fffffffffffff2d8 >> 0x10);
    keyword_00.numFlags.raw = (char)((uint)in_stack_fffffffffffff2d8 >> 0x18);
    keyword_00.info = (Info *)in_stack_fffffffffffff2e0._M_extent_value;
    endgenerate_00.info = (Info *)in_stack_fffffffffffff2f8;
    endgenerate_00._0_8_ = in_stack_fffffffffffff2f0;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::generateRegion
                        (local_a8,local_b0,keyword_00,
                         (SyntaxList<slang::syntax::MemberSyntax> *)0x8a26d0,endgenerate_00);
    break;
  case (pointer)0xb0:
    local_708 = local_30._M_ptr;
    local_700 = local_30._M_extent._M_extent_value;
    attributes_10._M_extent._M_extent_value = in_RDI._M_extent_value;
    attributes_10._M_ptr = ppAVar10;
    local_8 = (ConfigDeclarationSyntax *)
              parseGenvarDeclaration
                        ((Parser *)in_stack_fffffffffffff3e8._M_extent_value,attributes_10);
    break;
  case (pointer)0xb4:
    local_6e8 = local_30._M_ptr;
    local_6e0 = local_30._M_extent._M_extent_value;
    attributes_09._M_extent._M_extent_value = in_RDI._M_extent_value;
    attributes_09._M_ptr = ppAVar10;
    local_8 = (ConfigDeclarationSyntax *)
              parseIfGenerateConstruct
                        ((Parser *)in_stack_fffffffffffff3e8._M_extent_value,attributes_09);
    break;
  case (pointer)0xbb:
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_7b8 = TVar11.kind;
    if (local_7b8 == StringLiteral) {
      attributes_16._M_extent._M_extent_value = in_stack_fffffffffffff498._M_extent_value;
      attributes_16._M_ptr = in_stack_fffffffffffff490;
      local_8 = (ConfigDeclarationSyntax *)parseDPIImport(in_stack_fffffffffffff488,attributes_16);
    }
    else {
      attributes_18._M_ptr._4_4_ = in_stack_fffffffffffff4ac;
      attributes_18._M_ptr._0_4_ = in_stack_fffffffffffff4a8;
      attributes_18._M_extent._M_extent_value = in_stack_fffffffffffff4b0._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                parseImportDeclaration(in_stack_fffffffffffff4a0,attributes_18);
    }
    break;
  case (pointer)0xbe:
    local_608 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
    slang::syntax::SyntaxFacts::getProceduralBlockKind(local_608.kind);
    local_650 = local_30._M_ptr;
    local_648 = local_30._M_extent._M_extent_value;
    elements_07._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements_07._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements_07._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_07);
    TVar11 = local_608;
    local_660._0_2_ = local_608.kind;
    local_660._2_1_ = local_608._2_1_;
    local_660._3_1_ = local_608.numFlags.raw;
    local_660._4_4_ = local_608.rawLen;
    local_608.info = TVar11.info;
    local_658 = local_608.info;
    local_608 = TVar11;
    parseStatement(in_stack_fffffffffffffe08,(bool)in_stack_fffffffffffffe07,
                   (bool)in_stack_fffffffffffffe06);
    keyword_01.info = (Info *)in_stack_fffffffffffff2f0;
    keyword_01._0_8_ = in_stack_fffffffffffff2e8;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::proceduralBlock
                        ((SyntaxFactory *)in_stack_fffffffffffff2e0._M_extent_value,
                         in_stack_fffffffffffff2dc,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),keyword_01,
                         (StatementSyntax *)
                         CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
    break;
  case (pointer)0xc6:
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_270 = TVar11.kind;
    if (local_270 == ClassKeyword) {
      ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
      attributes_30._M_extent._M_extent_value = in_stack_fffffffffffff620._M_extent_value;
      attributes_30._M_ptr = in_stack_fffffffffffff618;
      virtualOrInterface.info = (Info *)in_stack_fffffffffffff610;
      virtualOrInterface.kind = (short)in_stack_fffffffffffff608;
      virtualOrInterface._2_1_ = (char)((ulong)in_stack_fffffffffffff608 >> 0x10);
      virtualOrInterface.numFlags.raw = (char)((ulong)in_stack_fffffffffffff608 >> 0x18);
      virtualOrInterface.rawLen = (int)((ulong)in_stack_fffffffffffff608 >> 0x20);
      local_8 = (ConfigDeclarationSyntax *)
                parseClassDeclaration(in_stack_fffffffffffff600,attributes_30,virtualOrInterface);
    }
    else {
      attributes_20._M_ptr._4_4_ = in_stack_fffffffffffff4bc;
      attributes_20._M_ptr._0_4_ = in_stack_fffffffffffff4b8;
      attributes_20._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                parseModule((Parser *)in_stack_fffffffffffff4b0._M_extent_value,attributes_20,
                            in_stack_fffffffffffff4ac,(bool *)in_stack_fffffffffffff4a0);
    }
    break;
  case (pointer)0xd3:
  case (pointer)0xd7:
  case (pointer)0xe6:
  case (pointer)0xed:
    attributes_19._M_ptr._4_4_ = in_stack_fffffffffffff4bc;
    attributes_19._M_ptr._0_4_ = in_stack_fffffffffffff4b8;
    attributes_19._M_extent._M_extent_value = in_stack_fffffffffffff4c0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)
              parseModule((Parser *)in_stack_fffffffffffff4b0._M_extent_value,attributes_19,
                          in_stack_fffffffffffff4ac,(bool *)in_stack_fffffffffffff4a0);
    break;
  case (pointer)0xd6:
    attributes_21._M_ptr._2_6_ = in_stack_fffffffffffff4ea;
    attributes_21._M_ptr._0_2_ = in_stack_fffffffffffff4e8;
    attributes_21._M_extent._M_extent_value = in_stack_fffffffffffff4f0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)
              parseModportDeclaration(in_stack_fffffffffffff4e0,attributes_21);
    break;
  case (pointer)0xeb:
    attr._M_extent._M_extent_value = in_stack_fffffffffffff3e8._M_extent_value;
    attr._M_ptr = (pointer)in_stack_fffffffffffff3e0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)parseUdpDeclaration(in_stack_fffffffffffff3d8,attr);
    break;
  case (pointer)0xee:
    local_8 = (ConfigDeclarationSyntax *)
              parsePropertyDeclaration(in_stack_fffffffffffff540,in_stack_fffffffffffff548);
    break;
  case (pointer)0xf7:
    ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
    elements_10._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements_10._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements_10._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_10);
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x8a409d);
    attributes_45._M_extent._M_extent_value = in_stack_fffffffffffff878._M_extent_value;
    attributes_45._M_ptr = in_stack_fffffffffffff870;
    parseDataDeclaration(in_stack_fffffffffffff868,attributes_45);
    rand_00.rawLen = in_stack_fffffffffffff2dc;
    rand_00.kind = (short)in_stack_fffffffffffff2d8;
    rand_00._2_1_ = (char)((uint)in_stack_fffffffffffff2d8 >> 0x10);
    rand_00.numFlags.raw = (char)((uint)in_stack_fffffffffffff2d8 >> 0x18);
    rand_00.info = (Info *)in_stack_fffffffffffff2e0._M_extent_value;
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::checkerDataDeclaration
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),rand_00,
                         (DataDeclarationSyntax *)0x8a40e2);
    break;
  case (pointer)0x103:
    std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::span
              ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)0x8a3373);
    attributes_15._M_extent._M_extent_value = in_stack_fffffffffffff478._M_extent_value;
    attributes_15._M_ptr = (pointer)in_stack_fffffffffffff470._M_extent_value;
    local_590 = parseConcurrentAssertion
                          (in_stack_fffffffffffff468,
                           (NamedLabelSyntax *)
                           CONCAT44(in_stack_fffffffffffff464.m_bits,in_stack_fffffffffffff460),
                           attributes_15);
    local_5e8 = local_30._M_ptr;
    local_5e0 = local_30._M_extent._M_extent_value;
    elements_06._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
    elements_06._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
    elements_06._M_extent._M_extent_value = in_stack_fffffffffffff2e0._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_06);
    slang::syntax::SyntaxNode::as<slang::syntax::ConcurrentAssertionStatementSyntax>
              ((SyntaxNode *)local_590);
    local_8 = (ConfigDeclarationSyntax *)
              slang::syntax::SyntaxFactory::concurrentAssertionMember
                        ((SyntaxFactory *)
                         CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                         (ConcurrentAssertionStatementSyntax *)0x8a3417);
    break;
  case (pointer)0x110:
    local_8 = (ConfigDeclarationSyntax *)
              parseSequenceDeclaration(in_stack_fffffffffffff540,in_stack_fffffffffffff548);
    break;
  case (pointer)0x118:
    attributes_03._M_ptr._2_2_ = in_stack_fffffffffffff34a;
    attributes_03._M_ptr._0_2_ = in_stack_fffffffffffff348;
    attributes_03._M_ptr._4_4_ = in_stack_fffffffffffff34c;
    attributes_03._M_extent._M_extent_value = in_stack_fffffffffffff350._M_extent_value;
    errorIfAttributes((Parser *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                      attributes_03);
    attributes_07._M_extent._M_extent_value = in_stack_fffffffffffff3e0._M_extent_value;
    attributes_07._M_ptr = (pointer)in_stack_fffffffffffff3d8;
    local_8 = (ConfigDeclarationSyntax *)
              parseSpecifyBlock((Parser *)
                                CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                                attributes_07);
    break;
  case (pointer)0x119:
    attr_00._M_ptr._2_1_ = SUB21(in_stack_fffffffffffff58a,0);
    attr_00._M_ptr._3_1_ = SUB21(in_stack_fffffffffffff58a,1);
    attr_00._M_ptr._0_2_ = in_stack_fffffffffffff588;
    attr_00._M_ptr._4_4_ = in_stack_fffffffffffff58c;
    attr_00._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffff590;
    attr_00._M_extent._M_extent_value._6_2_ = in_stack_fffffffffffff596;
    local_8 = (ConfigDeclarationSyntax *)
              parseSpecparam((Parser *)CONCAT26(in_stack_fffffffffffff586,in_stack_fffffffffffff580)
                             ,attr_00,in_stack_fffffffffffff57c);
    break;
  case (pointer)0x127:
    local_718 = local_30._M_ptr;
    local_710 = local_30._M_extent._M_extent_value;
    memset(&local_71c,0,4);
    bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_71c);
    attributes_11._M_extent._M_extent_value = in_stack_fffffffffffff470._M_extent_value;
    attributes_11._M_ptr = (pointer)in_stack_fffffffffffff468;
    local_8 = (ConfigDeclarationSyntax *)
              parseFunctionDeclaration
                        (in_stack_fffffffffffff458,attributes_11,
                         (SyntaxKind)((ulong)in_stack_fffffffffffff450 >> 0x20),
                         (TokenKind)((ulong)in_stack_fffffffffffff450 >> 0x10),
                         in_stack_fffffffffffff44c,in_stack_fffffffffffff464);
    break;
  case (pointer)0x12b:
  case (pointer)0x12c:
    attributes_02._M_ptr._2_2_ = in_stack_fffffffffffff34a;
    attributes_02._M_ptr._0_2_ = in_stack_fffffffffffff348;
    attributes_02._M_ptr._4_4_ = in_stack_fffffffffffff34c;
    attributes_02._M_extent._M_extent_value = in_stack_fffffffffffff350._M_extent_value;
    errorIfAttributes((Parser *)CONCAT44(in_stack_fffffffffffff344,in_stack_fffffffffffff340),
                      attributes_02);
    attributes_06._M_extent._M_extent_value = in_stack_fffffffffffff3e0._M_extent_value;
    attributes_06._M_ptr = (pointer)in_stack_fffffffffffff3d8;
    local_8 = (ConfigDeclarationSyntax *)
              parseTimeUnitsDeclaration
                        ((Parser *)CONCAT44(in_stack_fffffffffffff3d4,in_stack_fffffffffffff3d0),
                         attributes_06);
    break;
  case (pointer)0x143:
    TVar11 = ParserBase::peek((ParserBase *)
                              CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                              in_stack_fffffffffffff2d4);
    local_778 = TVar11.kind;
    if (local_778 == ClassKeyword) {
      ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
      attributes_32._M_extent._M_extent_value = in_stack_fffffffffffff620._M_extent_value;
      attributes_32._M_ptr = in_stack_fffffffffffff618;
      TVar11.info = (Info *)in_stack_fffffffffffff610;
      TVar11.kind = (short)in_stack_fffffffffffff608;
      TVar11._2_1_ = (char)((ulong)in_stack_fffffffffffff608 >> 0x10);
      TVar11.numFlags.raw = (char)((ulong)in_stack_fffffffffffff608 >> 0x18);
      TVar11.rawLen = (int)((ulong)in_stack_fffffffffffff608 >> 0x20);
      pCVar7 = parseClassDeclaration(in_stack_fffffffffffff600,attributes_32,TVar11);
      return &pCVar7->super_MemberSyntax;
    }
LAB_008a4226:
    bVar1 = slang::syntax::SyntaxFacts::isGateType(local_80.kind);
    if (bVar1) {
      attributes_40._M_extent._M_extent_value = in_stack_fffffffffffff680._M_extent_value;
      attributes_40._M_ptr = (pointer)in_stack_fffffffffffff678._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                parsePrimitiveInstantiation(in_stack_fffffffffffff670,attributes_40);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(local_80.kind);
      if (bVar1) {
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
        uVar19 = 0;
        do {
          uVar19 = uVar19 + 1;
          TVar11 = ParserBase::peek((ParserBase *)
                                    CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                    in_stack_fffffffffffff2d4);
          local_a40 = TVar11.kind;
          bVar1 = slang::syntax::SyntaxFacts::isMethodQualifier(local_a40);
          DVar16 = SUB84((ulong)in_stack_fffffffffffff300 >> 0x20,0);
        } while (bVar1);
        if ((local_a40 == FunctionKeyword) || (local_a40 == TaskKeyword)) {
          Token::range((Token *)in_stack_fffffffffffff2f0);
          SVar12.endLoc = in_stack_fffffffffffff2f8;
          SVar12.startLoc = in_stack_fffffffffffff2f0;
          ParserBase::addDiag(in_stack_fffffffffffff2e8,DVar16,SVar12);
          for (uVar18 = 0; uVar18 < uVar19; uVar18 = uVar18 + 1) {
            std::optional<slang::DiagCode>::optional
                      ((optional<slang::DiagCode> *)&stack0xfffffffffffff586);
            ParserBase::skipToken
                      (&in_stack_fffffffffffff398->super_ParserBase,
                       (_Optional_base<slang::DiagCode,_true,_true>)
                       SUB86((ulong)in_stack_fffffffffffff3a0 >> 0x10,0));
          }
          local_a8c = 0x1cb;
          if (local_a40 == FunctionKeyword) {
            local_a8c = 0xd9;
          }
          local_aa0 = local_30._M_ptr;
          local_a98 = local_30._M_extent._M_extent_value;
          slang::syntax::SyntaxFacts::getSkipToKind(local_a40);
          memset(&local_aa4,0,4);
          bitmask<slang::parsing::detail::FunctionOptions>::bitmask(&local_aa4);
          attributes_14._M_extent._M_extent_value = in_stack_fffffffffffff470._M_extent_value;
          attributes_14._M_ptr = (pointer)in_stack_fffffffffffff468;
          pFVar9 = parseFunctionDeclaration
                             (in_stack_fffffffffffff458,attributes_14,
                              (SyntaxKind)((ulong)in_stack_fffffffffffff450 >> 0x20),
                              (TokenKind)((ulong)in_stack_fffffffffffff450 >> 0x10),
                              in_stack_fffffffffffff44c,in_stack_fffffffffffff464);
          return &pFVar9->super_MemberSyntax;
        }
        if (local_a40 == ConstraintKeyword) {
          SmallVector<slang::parsing::Token,_4UL>::SmallVector
                    ((SmallVector<slang::parsing::Token,_4UL> *)0x8a44f0);
          src = extraout_RDX;
          for (uVar18 = 0; uVar18 < uVar19; uVar18 = uVar18 + 1) {
            TVar11 = ParserBase::consume((ParserBase *)in_stack_fffffffffffff2f0);
            TVar17 = TVar11.kind;
            SmallVectorBase<slang::parsing::Token>::push_back
                      ((SmallVectorBase<slang::parsing::Token> *)
                       CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                       (Token *)CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8));
            src = extraout_RDX_00;
            if (TVar17 != StaticKeyword) {
              bVar1 = slang::syntax::SyntaxFacts::isConstraintQualifier(TVar17);
              DVar16 = SUB84((ulong)in_stack_fffffffffffff300 >> 0x20,0);
              src = extraout_RDX_01;
              if (bVar1) {
                SVar12 = Token::range((Token *)in_stack_fffffffffffff2f0);
                range.endLoc = in_stack_fffffffffffff2f8;
                range.startLoc = in_stack_fffffffffffff2f0;
                this_01 = ParserBase::addDiag(in_stack_fffffffffffff2e8,DVar16,range);
                sVar13 = Token::valueText((Token *)in_stack_fffffffffffff2e0._M_extent_value);
                in_stack_fffffffffffff300 = sVar13._M_str;
                sVar13._M_str = (char *)SVar12.startLoc;
                sVar13._M_len = (size_t)SVar12.endLoc;
                Diagnostic::operator<<(this_01,sVar13);
                src = extraout_RDX_02;
              }
            }
          }
          SmallVectorBase<slang::parsing::Token>::copy
                    ((SmallVectorBase<slang::parsing::Token> *)&stack0xfffffffffffff500,
                     *(EVP_PKEY_CTX **)in_RDI._M_extent_value,src);
          attributes_42._M_extent._M_extent_value = in_stack_fffffffffffff688._M_extent_value;
          attributes_42._M_ptr = (pointer)in_stack_fffffffffffff680._M_extent_value;
          qualifiers_00._M_extent._M_extent_value = in_stack_fffffffffffff678._M_extent_value;
          qualifiers_00._M_ptr = (pointer)in_stack_fffffffffffff670;
          local_8 = (ConfigDeclarationSyntax *)
                    parseConstraint(in_stack_fffffffffffff668,attributes_42,qualifiers_00,
                                    (bool)in_stack_fffffffffffff667);
          SmallVector<slang::parsing::Token,_4UL>::~SmallVector
                    ((SmallVector<slang::parsing::Token,_4UL> *)0x8a4723);
          return &local_8->super_MemberSyntax;
        }
      }
      bVar1 = std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                        ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                         0x8a4737);
      if (bVar1) {
        local_8 = (ConfigDeclarationSyntax *)0x0;
      }
      else {
        this_02._M_extent_value = in_RDI._M_extent_value + 0xe0;
        elements_11._M_ptr._4_4_ = in_stack_fffffffffffff2dc;
        elements_11._M_ptr._0_4_ = in_stack_fffffffffffff2d8;
        elements_11._M_extent._M_extent_value = this_02._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                   CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),elements_11);
        slang::syntax::TokenList::TokenList
                  ((TokenList *)this_02._M_extent_value,
                   (nullptr_t)CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8));
        uVar14 = (undefined4)*(undefined8 *)in_RDI._M_extent_value;
        uVar15 = (undefined4)((ulong)*(undefined8 *)in_RDI._M_extent_value >> 0x20);
        Token::location(&local_80);
        location_00._4_4_ = in_stack_fffffffffffff5a4;
        location_00._0_4_ = in_stack_fffffffffffff5a0;
        Token::createMissing(in_stack_fffffffffffff598,in_stack_fffffffffffff596,location_00);
        semi_01.rawLen = uVar15;
        semi_01.kind = (short)uVar14;
        semi_01._2_1_ = (char)((uint)uVar14 >> 0x10);
        semi_01.numFlags.raw = (char)((uint)uVar14 >> 0x18);
        semi_01.info = (Info *)this_02._M_extent_value;
        local_8 = (ConfigDeclarationSyntax *)
                  slang::syntax::SyntaxFactory::emptyMember
                            ((SyntaxFactory *)
                             CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0),
                             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                             CONCAT44(in_stack_fffffffffffff2cc,in_stack_fffffffffffff2c8),
                             (TokenList *)0x8a4816,semi_01);
      }
    }
    break;
  case (pointer)0x153:
    local_4a0 = ParserBase::peek((ParserBase *)
                                 CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                 in_stack_fffffffffffff2d4);
    bVar1 = false;
    if (local_4a0.kind == DoubleColon) {
      local_4b0 = ParserBase::peek((ParserBase *)
                                   CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                   in_stack_fffffffffffff2d4);
      bVar1 = false;
      if (local_4b0.kind == Identifier) {
        local_4c0 = ParserBase::peek((ParserBase *)
                                     CONCAT44(in_stack_fffffffffffff2dc,in_stack_fffffffffffff2d8),
                                     in_stack_fffffffffffff2d4);
        bVar1 = local_4c0.kind == Identifier;
      }
    }
    if (bVar1) {
      local_4d0 = local_30._M_ptr;
      local_4c8 = local_30._M_extent._M_extent_value;
      attributes_25._M_ptr._4_4_ = in_stack_fffffffffffff4fc;
      attributes_25._M_ptr._0_4_ = in_stack_fffffffffffff4f8;
      attributes_25._M_extent._M_extent_value = in_stack_fffffffffffff500._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                parseCheckerInstantiation
                          ((Parser *)in_stack_fffffffffffff4f0._M_extent_value,attributes_25);
    }
    else {
      local_4e0 = local_30._M_ptr;
      local_4d8 = local_30._M_extent._M_extent_value;
      attributes_39._M_extent._M_extent_value = in_stack_fffffffffffff680._M_extent_value;
      attributes_39._M_ptr = (pointer)in_stack_fffffffffffff678._M_extent_value;
      local_8 = (ConfigDeclarationSyntax *)
                parseVariableDeclaration(in_stack_fffffffffffff670,attributes_39);
    }
  }
  return &local_8->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseMember(SyntaxKind parentKind, bool& anyLocalModules) {
    auto attributes = parseAttributes();

    if (isHierarchyInstantiation(/* requireName */ false))
        return &parseHierarchyInstantiation(attributes);
    if (isPortDeclaration(/* inStatement */ false))
        return &parsePortDeclaration(attributes);
    if (isNetDeclaration())
        return &parseNetDeclaration(attributes);
    if (isVariableDeclaration())
        return &parseVariableDeclaration(attributes);

    Token token = peek();
    switch (token.kind) {
        case TokenKind::GenerateKeyword: {
            errorIfAttributes(attributes);
            auto keyword = consume();

            Token endgenerate;
            auto members = parseMemberList<MemberSyntax>(
                TokenKind::EndGenerateKeyword, endgenerate, SyntaxKind::GenerateRegion,
                [this](SyntaxKind parentKind, bool& anyLocalModules) {
                    return parseMember(parentKind, anyLocalModules);
                });
            return &factory.generateRegion(attributes, keyword, members, endgenerate);
        }
        case TokenKind::BeginKeyword:
            errorIfAttributes(attributes);
            if (!attributes.empty()) {
                return &factory.emptyMember(attributes, nullptr,
                                            Token::createMissing(alloc, TokenKind::Semicolon,
                                                                 token.location()));
            }

            // It's definitely not legal to have a generate block here on its own
            // (without an if or for loop) but some simulators seems to accept it
            // and I've found code in the wild that depends on it. We'll parse it
            // here and then issue a diagnostic about how it's not kosher.
            addDiag(diag::NonStandardGenBlock, token.location());
            return &parseGenerateBlock();
        case TokenKind::TimeUnitKeyword:
        case TokenKind::TimePrecisionKeyword:
            errorIfAttributes(attributes);
            return &parseTimeUnitsDeclaration(attributes);
        case TokenKind::ModuleKeyword:
        case TokenKind::MacromoduleKeyword:
        case TokenKind::ProgramKeyword:
        case TokenKind::PackageKeyword:
            // modules, interfaces, and programs share the same syntax
            return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::InterfaceKeyword:
            // an interface class is different from an interface
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            else
                return &parseModule(attributes, parentKind, anyLocalModules);
        case TokenKind::ModPortKeyword:
            return &parseModportDeclaration(attributes);
        case TokenKind::BindKeyword:
            return &parseBindDirective(attributes);
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam(attributes, parentKind);
        case TokenKind::AliasKeyword:
            return &parseNetAlias(attributes);
        case TokenKind::SpecifyKeyword:
            errorIfAttributes(attributes);
            return &parseSpecifyBlock(attributes);
        case TokenKind::Identifier:
            if (peek(1).kind == TokenKind::Colon) {
                // Declarations and instantiations have already been handled, so if we reach this
                // point we either have a labeled assertion, or this is some kind of error.
                TokenKind next = peek(2).kind;
                if (next == TokenKind::AssertKeyword || next == TokenKind::AssumeKeyword ||
                    next == TokenKind::CoverKeyword) {

                    auto name = consume();
                    auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
                    auto& statement = parseAssertionStatement(&label, {});
                    switch (statement.kind) {
                        case SyntaxKind::ImmediateAssertStatement:
                        case SyntaxKind::ImmediateAssumeStatement:
                        case SyntaxKind::ImmediateCoverStatement:
                            return &factory.immediateAssertionMember(
                                attributes, statement.as<ImmediateAssertionStatementSyntax>());
                        default:
                            return &factory.concurrentAssertionMember(
                                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
                    }
                }
            }

            // If there's a hash or parenthesis here this is likely a primitive instantiation.
            if (peek(1).kind == TokenKind::Hash || peek(1).kind == TokenKind::OpenParenthesis) {
                return &parsePrimitiveInstantiation(attributes);
            }

            // A double colon could be a package-scoped checker instantiation.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }

            // Otherwise, assume it's an (erroneous) attempt at a variable declaration.
            return &parseVariableDeclaration(attributes);
        case TokenKind::UnitSystemName: {
            // The only valid thing this can be is a checker instantiation, since
            // variable declarations would have been handled previously. Because these
            // are rare, disambiguate for a bit and then fall back to parsing as a
            // variable decl anyway for a better error message.
            if (peek(1).kind == TokenKind::DoubleColon && peek(2).kind == TokenKind::Identifier &&
                peek(3).kind == TokenKind::Identifier) {
                return &parseCheckerInstantiation(attributes);
            }
            return &parseVariableDeclaration(attributes);
        }
        case TokenKind::AssertKeyword:
        case TokenKind::AssumeKeyword:
        case TokenKind::CoverKeyword: {
            auto& statement = parseAssertionStatement(nullptr, {});
            switch (statement.kind) {
                case SyntaxKind::ImmediateAssertStatement:
                case SyntaxKind::ImmediateAssumeStatement:
                case SyntaxKind::ImmediateCoverStatement:
                    return &factory.immediateAssertionMember(
                        attributes, statement.as<ImmediateAssertionStatementSyntax>());
                default:
                    return &factory.concurrentAssertionMember(
                        attributes, statement.as<ConcurrentAssertionStatementSyntax>());
            }
        }
        case TokenKind::RestrictKeyword: {
            auto& statement = parseConcurrentAssertion(nullptr, {});
            return &factory.concurrentAssertionMember(
                attributes, statement.as<ConcurrentAssertionStatementSyntax>());
        }
        case TokenKind::AssignKeyword:
            return &parseContinuousAssign(attributes);
        case TokenKind::InitialKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement());
        }
        case TokenKind::FinalKeyword:
        case TokenKind::AlwaysKeyword:
        case TokenKind::AlwaysCombKeyword:
        case TokenKind::AlwaysFFKeyword:
        case TokenKind::AlwaysLatchKeyword: {
            auto keyword = consume();
            return &factory.proceduralBlock(getProceduralBlockKind(keyword.kind), attributes,
                                            keyword, parseStatement(false));
        }
        case TokenKind::ForKeyword:
            return &parseLoopGenerateConstruct(attributes);
        case TokenKind::IfKeyword:
            return &parseIfGenerateConstruct(attributes);
        case TokenKind::CaseKeyword:
            return &parseCaseGenerateConstruct(attributes);
        case TokenKind::GenVarKeyword:
            return &parseGenvarDeclaration(attributes);
        case TokenKind::TaskKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::TaskDeclaration,
                                             TokenKind::EndTaskKeyword, parentKind);
        case TokenKind::FunctionKeyword:
            return &parseFunctionDeclaration(attributes, SyntaxKind::FunctionDeclaration,
                                             TokenKind::EndFunctionKeyword, parentKind);
        case TokenKind::CoverGroupKeyword:
            return &parseCovergroupDeclaration(attributes, /* inClass */ false,
                                               /* hasBaseClass */ false);
        case TokenKind::ClassKeyword:
            return &parseClassDeclaration(attributes, Token());
        case TokenKind::VirtualKeyword:
            if (peek(1).kind == TokenKind::ClassKeyword)
                return &parseClassDeclaration(attributes, consume());
            break;
        case TokenKind::DefParamKeyword:
            return &parseDefParam(attributes);
        case TokenKind::ImportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIImport(attributes);
            }
            return &parseImportDeclaration(attributes);
        case TokenKind::ExportKeyword:
            if (peek(1).kind == TokenKind::StringLiteral) {
                return &parseDPIExport(attributes);
            }
            return &parseExportDeclaration(attributes);
        case TokenKind::Semicolon:
            return &factory.emptyMember(attributes, nullptr, consume());
        case TokenKind::PropertyKeyword:
            return &parsePropertyDeclaration(attributes);
        case TokenKind::SequenceKeyword:
            return &parseSequenceDeclaration(attributes);
        case TokenKind::CheckerKeyword:
            return &parseCheckerDeclaration(attributes);
        case TokenKind::GlobalKeyword:
        case TokenKind::DefaultKeyword:
            if (peek(1).kind == TokenKind::ClockingKeyword) {
                return &parseClockingDeclaration(attributes);
            }
            else if (peek(1).kind == TokenKind::DisableKeyword &&
                     token.kind == TokenKind::DefaultKeyword) {
                return &parseDefaultDisable(attributes);
            }
            break;
        case TokenKind::ClockingKeyword:
            return &parseClockingDeclaration(attributes);
        case TokenKind::SystemIdentifier: {
            auto result = parseElabSystemTask(attributes);
            if (result)
                return result;
            break;
        }
        case TokenKind::ConstraintKeyword:
            return &parseConstraint(attributes, {}, true);
        case TokenKind::PrimitiveKeyword:
            return &parseUdpDeclaration(attributes);
        case TokenKind::RandKeyword: {
            auto rand = consume();
            return &factory.checkerDataDeclaration(attributes, rand, parseDataDeclaration({}));
        }
        case TokenKind::ExternKeyword:
            errorIfAttributes(attributes);
            if (auto member = parseExternMember(parentKind, attributes))
                return member;
            break;
        case TokenKind::ConfigKeyword:
            errorIfAttributes(attributes);
            return &parseConfigDeclaration(attributes);
        default:
            break;
    }

    if (isGateType(token.kind))
        return &parsePrimitiveInstantiation(attributes);

    // If this is a class qualifier, maybe they accidentally put them
    // on an out-of-block method definition.
    if (isMethodQualifier(token.kind)) {
        Token t;
        uint32_t index = 0;
        do {
            t = peek(++index);
        } while (isMethodQualifier(t.kind));

        if (t.kind == TokenKind::FunctionKeyword || t.kind == TokenKind::TaskKeyword) {
            // Skip all the qualifiers.
            addDiag(diag::QualifiersOnOutOfBlock, token.range());
            for (uint32_t i = 0; i < index; i++)
                skipToken(std::nullopt);

            auto kind = t.kind == TokenKind::FunctionKeyword ? SyntaxKind::FunctionDeclaration
                                                             : SyntaxKind::TaskDeclaration;
            return &parseFunctionDeclaration(attributes, kind, getSkipToKind(t.kind), parentKind);
        }

        if (t.kind == TokenKind::ConstraintKeyword) {
            // Out-of-block constraints can legitimately have the 'static' keyword,
            // but nothing else.
            SmallVector<Token, 4> quals;
            for (uint32_t i = 0; i < index; i++) {
                Token qual = consume();
                quals.push_back(qual);

                if (qual.kind != TokenKind::StaticKeyword && isConstraintQualifier(qual.kind))
                    addDiag(diag::ConstraintQualOutOfBlock, qual.range()) << qual.valueText();
            }

            return &parseConstraint(attributes, quals.copy(alloc), true);
        }
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         token.location()));
    }

    // Otherwise, we got nothing and should just return null so that our
    // caller will skip and try again.
    return nullptr;
}